

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O2

void ARGBBlendRow_C(uint8_t *src_argb0,uint8_t *src_argb1,uint8_t *dst_argb,int width)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  uint8_t uVar8;
  uint uVar9;
  
  for (lVar5 = 0; (int)lVar5 < width + -1; lVar5 = lVar5 + 2) {
    bVar1 = src_argb0[lVar5 * 4 + 1];
    bVar2 = src_argb0[lVar5 * 4 + 2];
    bVar3 = src_argb1[lVar5 * 4 + 1];
    bVar4 = src_argb1[lVar5 * 4 + 2];
    iVar6 = 0x100 - (uint)src_argb0[lVar5 * 4 + 3];
    uVar9 = ((uint)src_argb1[lVar5 * 4] * iVar6 >> 8) + (uint)src_argb0[lVar5 * 4];
    uVar8 = (uint8_t)uVar9;
    if (0xfe < uVar9) {
      uVar8 = 0xff;
    }
    dst_argb[lVar5 * 4] = uVar8;
    uVar9 = ((uint)bVar3 * iVar6 >> 8) + (uint)bVar1;
    uVar8 = (uint8_t)uVar9;
    if (0xfe < uVar9) {
      uVar8 = 0xff;
    }
    dst_argb[lVar5 * 4 + 1] = uVar8;
    uVar9 = (iVar6 * (uint)bVar4 >> 8) + (uint)bVar2;
    uVar8 = (uint8_t)uVar9;
    if (0xfe < uVar9) {
      uVar8 = 0xff;
    }
    dst_argb[lVar5 * 4 + 2] = uVar8;
    dst_argb[lVar5 * 4 + 3] = 0xff;
    bVar1 = src_argb0[lVar5 * 4 + 5];
    bVar2 = src_argb0[lVar5 * 4 + 6];
    bVar3 = src_argb1[lVar5 * 4 + 5];
    bVar4 = src_argb1[lVar5 * 4 + 6];
    iVar6 = 0x100 - (uint)src_argb0[lVar5 * 4 + 7];
    uVar9 = ((uint)src_argb1[lVar5 * 4 + 4] * iVar6 >> 8) + (uint)src_argb0[lVar5 * 4 + 4];
    uVar8 = (uint8_t)uVar9;
    if (0xfe < uVar9) {
      uVar8 = 0xff;
    }
    dst_argb[lVar5 * 4 + 4] = uVar8;
    uVar9 = ((uint)bVar3 * iVar6 >> 8) + (uint)bVar1;
    if (0xfe < uVar9) {
      uVar9 = 0xff;
    }
    uVar7 = (iVar6 * (uint)bVar4 >> 8) + (uint)bVar2;
    if (0xfe < uVar7) {
      uVar7 = 0xff;
    }
    dst_argb[lVar5 * 4 + 5] = (uint8_t)uVar9;
    dst_argb[lVar5 * 4 + 6] = (uint8_t)uVar7;
    dst_argb[lVar5 * 4 + 7] = 0xff;
  }
  if ((width & 1U) != 0) {
    bVar1 = src_argb0[lVar5 * 4 + 1];
    bVar2 = src_argb0[lVar5 * 4 + 2];
    bVar3 = src_argb1[lVar5 * 4 + 1];
    bVar4 = src_argb1[lVar5 * 4 + 2];
    iVar6 = 0x100 - (uint)src_argb0[lVar5 * 4 + 3];
    uVar9 = ((uint)src_argb1[lVar5 * 4] * iVar6 >> 8) + (uint)src_argb0[lVar5 * 4];
    uVar8 = (uint8_t)uVar9;
    if (0xfe < uVar9) {
      uVar8 = 0xff;
    }
    dst_argb[lVar5 * 4] = uVar8;
    uVar9 = ((uint)bVar3 * iVar6 >> 8) + (uint)bVar1;
    uVar8 = (uint8_t)uVar9;
    if (0xfe < uVar9) {
      uVar8 = 0xff;
    }
    dst_argb[lVar5 * 4 + 1] = uVar8;
    uVar9 = (iVar6 * (uint)bVar4 >> 8) + (uint)bVar2;
    uVar8 = (uint8_t)uVar9;
    if (0xfe < uVar9) {
      uVar8 = 0xff;
    }
    dst_argb[lVar5 * 4 + 2] = uVar8;
    dst_argb[lVar5 * 4 + 3] = 0xff;
  }
  return;
}

Assistant:

void ARGBBlendRow_C(const uint8_t* src_argb0,
                    const uint8_t* src_argb1,
                    uint8_t* dst_argb,
                    int width) {
  int x;
  for (x = 0; x < width - 1; x += 2) {
    uint32_t fb = src_argb0[0];
    uint32_t fg = src_argb0[1];
    uint32_t fr = src_argb0[2];
    uint32_t a = src_argb0[3];
    uint32_t bb = src_argb1[0];
    uint32_t bg = src_argb1[1];
    uint32_t br = src_argb1[2];
    dst_argb[0] = BLEND(fb, bb, a);
    dst_argb[1] = BLEND(fg, bg, a);
    dst_argb[2] = BLEND(fr, br, a);
    dst_argb[3] = 255u;

    fb = src_argb0[4 + 0];
    fg = src_argb0[4 + 1];
    fr = src_argb0[4 + 2];
    a = src_argb0[4 + 3];
    bb = src_argb1[4 + 0];
    bg = src_argb1[4 + 1];
    br = src_argb1[4 + 2];
    dst_argb[4 + 0] = BLEND(fb, bb, a);
    dst_argb[4 + 1] = BLEND(fg, bg, a);
    dst_argb[4 + 2] = BLEND(fr, br, a);
    dst_argb[4 + 3] = 255u;
    src_argb0 += 8;
    src_argb1 += 8;
    dst_argb += 8;
  }

  if (width & 1) {
    uint32_t fb = src_argb0[0];
    uint32_t fg = src_argb0[1];
    uint32_t fr = src_argb0[2];
    uint32_t a = src_argb0[3];
    uint32_t bb = src_argb1[0];
    uint32_t bg = src_argb1[1];
    uint32_t br = src_argb1[2];
    dst_argb[0] = BLEND(fb, bb, a);
    dst_argb[1] = BLEND(fg, bg, a);
    dst_argb[2] = BLEND(fr, br, a);
    dst_argb[3] = 255u;
  }
}